

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_HTMLparser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  htmlDocPtr pxVar22;
  long lVar23;
  htmlParserCtxtPtr pxVar24;
  xmlDocPtr pxVar25;
  xmlParserCtxtPtr pxVar26;
  ulong uVar27;
  undefined8 uVar28;
  ulong uVar29;
  undefined8 uVar30;
  undefined8 extraout_RDX;
  int n_options;
  uint uVar31;
  ulong *puVar32;
  uint *puVar33;
  int n_inlen;
  int iVar34;
  uint uVar35;
  int iVar36;
  int *piVar37;
  ulong uVar38;
  undefined *puVar39;
  int test_ret_14;
  int iVar40;
  undefined8 uVar41;
  int test_ret_15;
  undefined4 *puVar42;
  undefined8 *puVar43;
  char *pcVar44;
  ulong uVar45;
  int test_ret_11;
  int iVar46;
  int *piVar47;
  int n_name;
  uint uVar48;
  undefined4 uVar49;
  uint uVar50;
  bool bVar51;
  int test_ret_1;
  int test_ret_2;
  int test_ret;
  int test_ret_5;
  int test_ret_6;
  int test_ret_4;
  int test_ret_21;
  int test_ret_22;
  int test_ret_3;
  int test_ret_7;
  int local_8c;
  int local_80;
  int local_74;
  int local_64;
  int local_50;
  int local_3c;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 37 of 43 functions ...");
  }
  iVar36 = 0;
  uVar48 = 0;
  do {
    uVar41 = 0;
    if (uVar48 == 0) {
      uVar41 = 0x15c434;
    }
    iVar34 = 0;
    do {
      iVar1 = xmlMemBlocks();
      uVar28 = 0;
      if (iVar34 == 0) {
        uVar28 = 0x15c43c;
      }
      UTF8ToHtml(0,uVar41,0,uVar28);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in UTF8ToHtml",(ulong)(uint)(iVar2 - iVar1));
        iVar36 = iVar36 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar48);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      iVar34 = iVar34 + 1;
    } while (iVar34 == 1);
    bVar51 = uVar48 == 0;
    uVar48 = uVar48 + 1;
  } while (bVar51);
  function_tests = function_tests + 1;
  local_8c = 0;
  uVar48 = 0;
  do {
    puVar42 = &DAT_00157254;
    uVar27 = 0;
    do {
      iVar34 = xmlMemBlocks();
      if (uVar48 < 4) {
        uVar29 = (&DAT_00159d60)[uVar48];
      }
      else {
        uVar29 = 0;
      }
      uVar49 = 0xffffffff;
      uVar35 = (uint)uVar27;
      if (uVar35 < 4) {
        uVar49 = *puVar42;
      }
      htmlAttrAllowed(0,uVar29,uVar49);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar34 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar1 - iVar34));
        local_8c = local_8c + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        uVar29 = uVar27;
      }
      uVar35 = uVar35 + 1;
      uVar27 = (ulong)uVar35;
      puVar42 = puVar42 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  iVar34 = 0;
  uVar48 = 0;
  do {
    puVar32 = &DAT_00159d60;
    uVar35 = 0;
    do {
      iVar2 = (int)uVar29;
      iVar1 = xmlMemBlocks();
      pxVar22 = gen_htmlDocPtr(uVar48,iVar2);
      if (uVar35 < 4) {
        uVar29 = *puVar32;
      }
      else {
        uVar29 = 0;
      }
      htmlAutoCloseTag(pxVar22,uVar29,0);
      call_tests = call_tests + 1;
      if (((pxVar22 != (htmlDocPtr)0x0) && (api_doc != pxVar22)) && (pxVar22->doc != api_doc)) {
        xmlFreeDoc(pxVar22);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar2 - iVar1));
        iVar34 = iVar34 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        uVar29 = 0;
        printf(" %d");
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      puVar32 = puVar32 + 1;
    } while (uVar35 != 5);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar48 = 0;
  do {
    puVar43 = &DAT_00159d48;
    uVar35 = 0;
    do {
      iVar2 = xmlMemBlocks();
      if (uVar48 < 5) {
        puVar39 = (&PTR_anon_var_dwarf_682_00159d20)[uVar48];
      }
      else {
        puVar39 = (undefined *)0x0;
      }
      if (uVar35 < 3) {
        uVar41 = *puVar43;
      }
      else {
        uVar41 = 0;
      }
      lVar23 = htmlCreateFileParserCtxt(puVar39,uVar41);
      if (lVar23 != 0) {
        htmlFreeParserCtxt();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateFileParserCtxt",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      puVar43 = puVar43 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 6);
  function_tests = function_tests + 1;
  uVar48 = 0;
  local_64 = 0;
  do {
    piVar47 = &DAT_00157254;
    uVar35 = 0;
    do {
      iVar2 = xmlMemBlocks();
      if (uVar48 == 0) {
        bVar51 = false;
        pcVar44 = "foo";
      }
      else if (uVar48 == 2) {
        bVar51 = false;
        pcVar44 = "test/ent2";
      }
      else if (uVar48 == 1) {
        bVar51 = false;
        pcVar44 = "<foo/>";
      }
      else {
        bVar51 = true;
        pcVar44 = (char *)0x0;
      }
      iVar3 = -1;
      if (uVar35 < 4) {
        iVar3 = *piVar47;
      }
      if ((!bVar51) && (iVar4 = xmlStrlen(pcVar44), iVar4 < iVar3)) {
        iVar3 = 0;
      }
      lVar23 = htmlCreateMemoryParserCtxt(pcVar44,iVar3);
      if (lVar23 != 0) {
        htmlFreeParserCtxt(lVar23);
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",(ulong)(uint)(iVar3 - iVar2))
        ;
        local_64 = local_64 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d",(ulong)uVar35);
        putchar(10);
      }
      uVar35 = uVar35 + 1;
      piVar47 = piVar47 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  local_74 = 0;
  iVar2 = 0;
  do {
    iVar3 = 0;
    do {
      uVar27 = 0;
      do {
        uVar48 = 0;
        do {
          piVar47 = (int *)0x0;
          puVar42 = &DAT_0014b228;
          do {
            iVar4 = xmlMemBlocks();
            piVar37 = &call_tests;
            if (iVar2 != 0) {
              if (iVar2 == 1) {
                piVar37 = (int *)0xffffffffffffffff;
              }
              else {
                piVar37 = (int *)0x0;
              }
            }
            if (iVar3 == 0) {
              bVar51 = false;
              pcVar44 = "foo";
            }
            else if (iVar3 == 2) {
              bVar51 = false;
              pcVar44 = "test/ent2";
            }
            else if (iVar3 == 1) {
              bVar51 = false;
              pcVar44 = "<foo/>";
            }
            else {
              bVar51 = true;
              pcVar44 = (char *)0x0;
            }
            iVar6 = -1;
            if ((uint)uVar27 < 4) {
              iVar6 = (&DAT_00157254)[uVar27];
            }
            if (uVar48 < 5) {
              puVar39 = (&PTR_anon_var_dwarf_682_00159d20)[uVar48];
            }
            else {
              puVar39 = (undefined *)0x0;
            }
            uVar49 = 0xffffffff;
            uVar35 = (uint)piVar47;
            if (uVar35 < 3) {
              uVar49 = *puVar42;
            }
            if ((!bVar51) && (iVar5 = xmlStrlen(pcVar44), iVar5 < iVar6)) {
              iVar6 = 0;
            }
            lVar23 = htmlCreatePushParserCtxt(0,piVar37,pcVar44,iVar6,puVar39,uVar49);
            if (lVar23 != 0) {
              htmlFreeParserCtxt(lVar23);
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar4 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                     (ulong)(uint)(iVar6 - iVar4));
              local_74 = local_74 + 1;
              printf(" %d",0);
              printf(" %d",iVar2);
              printf(" %d",iVar3);
              printf(" %d",uVar27);
              printf(" %d",(ulong)uVar48);
              printf(" %d");
              putchar(10);
              piVar37 = piVar47;
            }
            uVar35 = uVar35 + 1;
            piVar47 = (int *)(ulong)uVar35;
            puVar42 = puVar42 + 1;
          } while (uVar35 != 4);
          uVar48 = uVar48 + 1;
        } while (uVar48 != 6);
        uVar48 = (uint)uVar27 + 1;
        uVar27 = (ulong)uVar48;
      } while (uVar48 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 4);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar3 = 0;
  do {
    iVar6 = (int)piVar37;
    iVar4 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(iVar3,iVar6);
    piVar37 = (int *)0x0;
    pxVar25 = (xmlDocPtr)htmlCtxtParseDocument(pxVar24);
    if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
      xmlFreeDoc(pxVar25);
    }
    call_tests = call_tests + 1;
    if (pxVar24 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar24);
    }
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar4 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtParseDocument",(ulong)(uint)(iVar6 - iVar4));
      iVar2 = iVar2 + 1;
      printf(" %d");
      piVar37 = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  function_tests = function_tests + 1;
  local_38 = &DAT_00159d60;
  local_3c = 0;
  uVar48 = 0;
  do {
    uVar35 = 0;
    do {
      uVar27 = 0;
      do {
        uVar29 = 0;
        do {
          piVar47 = (int *)0x0;
          puVar42 = &DAT_00157254;
          do {
            iVar4 = (int)piVar37;
            iVar3 = xmlMemBlocks();
            pxVar24 = gen_htmlParserCtxtPtr(uVar48,iVar4);
            if (uVar35 < 4) {
              piVar37 = (int *)(&DAT_00159d60)[uVar35];
            }
            else {
              piVar37 = (int *)0x0;
            }
            if ((uint)uVar27 < 3) {
              uVar41 = (&DAT_00159d48)[uVar27];
            }
            else {
              uVar41 = 0;
            }
            if ((uint)uVar29 < 3) {
              uVar28 = (&DAT_00159d48)[uVar29];
            }
            else {
              uVar28 = 0;
            }
            uVar49 = 0xffffffff;
            uVar31 = (uint)piVar47;
            if (uVar31 < 4) {
              uVar49 = *puVar42;
            }
            pxVar25 = (xmlDocPtr)htmlCtxtReadDoc(pxVar24,piVar37,uVar41,uVar28,uVar49);
            if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc))
            {
              xmlFreeDoc(pxVar25);
            }
            call_tests = call_tests + 1;
            if (pxVar24 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt(pxVar24);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar4 - iVar3));
              local_3c = local_3c + 1;
              printf(" %d",(ulong)uVar48);
              printf(" %d",(ulong)uVar35);
              printf(" %d",uVar27);
              printf(" %d",uVar29);
              printf(" %d");
              putchar(10);
              piVar37 = piVar47;
            }
            uVar31 = uVar31 + 1;
            piVar47 = (int *)(ulong)uVar31;
            puVar42 = puVar42 + 1;
          } while (uVar31 != 4);
          uVar31 = (uint)uVar29 + 1;
          uVar29 = (ulong)uVar31;
        } while (uVar31 != 4);
        uVar31 = (uint)uVar27 + 1;
        uVar27 = (ulong)uVar31;
      } while (uVar31 != 4);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 5);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar36 = local_8c + iVar36 + iVar34 + iVar1 + local_64 + local_74;
  iVar34 = 0;
  do {
    uVar48 = 0;
    do {
      uVar27 = 0;
      do {
        puVar42 = &DAT_00157254;
        uVar35 = 0;
        do {
          pxVar24 = gen_htmlParserCtxtPtr(iVar34,(int)piVar37);
          if (uVar48 < 7) {
            piVar37 = (int *)(&DAT_00159d80)[uVar48];
          }
          else {
            piVar37 = (int *)0x0;
          }
          if ((uint)uVar27 < 3) {
            uVar41 = (&DAT_00159d48)[uVar27];
          }
          else {
            uVar41 = 0;
          }
          uVar49 = 0xffffffff;
          if (uVar35 < 4) {
            uVar49 = *puVar42;
          }
          pxVar25 = (xmlDocPtr)htmlCtxtReadFile(pxVar24,piVar37,uVar41,uVar49);
          if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
            xmlFreeDoc(pxVar25);
          }
          call_tests = call_tests + 1;
          if (pxVar24 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar24);
          }
          xmlResetLastError();
          uVar35 = uVar35 + 1;
          puVar42 = puVar42 + 1;
        } while (uVar35 != 4);
        uVar35 = (uint)uVar27 + 1;
        uVar27 = (ulong)uVar35;
      } while (uVar35 != 4);
      uVar48 = uVar48 + 1;
    } while (uVar48 != 8);
    iVar34 = iVar34 + 1;
  } while (iVar34 != 3);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar48 = 0;
  do {
    uVar35 = 0;
    do {
      uVar31 = 0;
      do {
        uVar27 = 0;
        do {
          uVar7 = 0;
          do {
            piVar47 = (int *)0x0;
            do {
              iVar1 = (int)piVar37;
              iVar34 = xmlMemBlocks();
              pxVar24 = gen_htmlParserCtxtPtr(uVar48,iVar1);
              if (uVar35 == 0) {
                pcVar44 = "foo";
LAB_00118315:
                bVar51 = false;
              }
              else {
                if (uVar35 == 2) {
                  pcVar44 = "test/ent2";
                  goto LAB_00118315;
                }
                if (uVar35 == 1) {
                  bVar51 = false;
                  pcVar44 = "<foo/>";
                }
                else {
                  bVar51 = true;
                  pcVar44 = (char *)0x0;
                }
              }
              iVar1 = -1;
              if (uVar31 < 4) {
                iVar1 = (&DAT_00157254)[uVar31];
              }
              if ((uint)uVar27 < 3) {
                uVar41 = (&DAT_00159d48)[uVar27];
              }
              else {
                uVar41 = 0;
              }
              iVar3 = (int)piVar47;
              if ((!bVar51) && (iVar4 = xmlStrlen(pcVar44), iVar4 < iVar1)) {
                iVar1 = 0;
              }
              pxVar25 = (xmlDocPtr)htmlCtxtReadMemory(pxVar24,pcVar44,iVar1,uVar41);
              if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar25);
              }
              call_tests = call_tests + 1;
              if (pxVar24 != (htmlParserCtxtPtr)0x0) {
                htmlFreeParserCtxt(pxVar24);
              }
              xmlResetLastError();
              iVar1 = xmlMemBlocks();
              piVar37 = (int *)pcVar44;
              if (iVar34 != iVar1) {
                iVar1 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCtxtReadMemory",(ulong)(uint)(iVar1 - iVar34)
                      );
                local_64 = local_64 + 1;
                printf(" %d",(ulong)uVar48);
                printf(" %d",(ulong)uVar35);
                printf(" %d",(ulong)uVar31);
                printf(" %d",uVar27);
                printf(" %d",(ulong)uVar7);
                printf(" %d");
                putchar(10);
                piVar37 = piVar47;
              }
              uVar50 = iVar3 + 1;
              piVar47 = (int *)(ulong)uVar50;
            } while (uVar50 != 4);
            uVar7 = uVar7 + 1;
          } while (uVar7 != 4);
          uVar7 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar7;
        } while (uVar7 != 4);
        uVar31 = uVar31 + 1;
      } while (uVar31 != 4);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar34 = 0;
  do {
    iVar1 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)piVar37);
    htmlCtxtReset(pxVar24);
    call_tests = call_tests + 1;
    if (pxVar24 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar24);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar1 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar3 - iVar1));
      iVar34 = iVar34 + 1;
      piVar37 = (int *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar48 = 0;
  do {
    puVar33 = &DAT_00157254;
    piVar47 = (int *)0x0;
    do {
      iVar4 = (int)piVar37;
      iVar3 = xmlMemBlocks();
      pxVar26 = gen_xmlParserCtxtPtr(uVar48,iVar4);
      piVar37 = (int *)0xffffffff;
      uVar35 = (uint)piVar47;
      if (uVar35 < 4) {
        piVar37 = (int *)(ulong)*puVar33;
      }
      htmlCtxtSetOptions(pxVar26);
      call_tests = call_tests + 1;
      if (pxVar26 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar26);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtSetOptions",(ulong)(uint)(iVar4 - iVar3));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        piVar37 = piVar47;
      }
      uVar35 = uVar35 + 1;
      piVar47 = (int *)(ulong)uVar35;
      puVar33 = puVar33 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar48 = 0;
  do {
    puVar33 = &DAT_00157254;
    piVar47 = (int *)0x0;
    do {
      iVar6 = (int)piVar37;
      iVar4 = xmlMemBlocks();
      pxVar24 = gen_htmlParserCtxtPtr(uVar48,iVar6);
      piVar37 = (int *)0xffffffff;
      uVar35 = (uint)piVar47;
      if (uVar35 < 4) {
        piVar37 = (int *)(ulong)*puVar33;
      }
      htmlCtxtUseOptions(pxVar24);
      call_tests = call_tests + 1;
      if (pxVar24 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt(pxVar24);
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar4 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar6 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar48);
        printf(" %d");
        putchar(10);
        piVar37 = piVar47;
      }
      uVar35 = uVar35 + 1;
      piVar47 = (int *)(ulong)uVar35;
      puVar33 = puVar33 + 1;
    } while (uVar35 != 4);
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar4 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar41 = *local_38;
    }
    else {
      uVar41 = 0;
    }
    htmlElementAllowedHere(0,uVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar6 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar5 - iVar6));
      iVar4 = iVar4 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    local_38 = local_38 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  htmlElementStatusHere(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar6 != iVar5) {
    iVar8 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlElementStatusHere",(ulong)(uint)(iVar8 - iVar6));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = 0;
  uVar27 = 0;
  do {
    uVar29 = 0;
    iVar40 = (int)uVar27;
    uVar45 = 0;
    if (iVar40 == 0) {
      uVar45 = 0x15c434;
    }
    do {
      iVar11 = (int)uVar29;
      uVar41 = 0;
      if (iVar11 == 0) {
        uVar41 = 0x15c43c;
      }
      puVar42 = &DAT_00157254;
      uVar48 = 0;
      do {
        iVar9 = xmlMemBlocks();
        uVar49 = 0xffffffff;
        if (uVar48 < 4) {
          uVar49 = *puVar42;
        }
        uVar38 = uVar45;
        htmlEncodeEntities(0,uVar45,0,uVar41,uVar49);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar10 - iVar9));
          iVar8 = iVar8 + 1;
          printf(" %d",0);
          printf(" %d",uVar27);
          printf(" %d",0);
          printf(" %d",uVar29);
          uVar38 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
        puVar42 = puVar42 + 1;
      } while (uVar48 != 4);
      uVar29 = (ulong)(iVar11 + 1);
    } while (iVar11 == 0);
    uVar27 = (ulong)(iVar40 + 1);
  } while (iVar40 == 0);
  function_tests = function_tests + 1;
  puVar43 = &DAT_00159d60;
  uVar48 = 0;
  iVar40 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar41 = *puVar43;
    }
    else {
      uVar41 = 0;
    }
    htmlEntityLookup(uVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar11 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar9 - iVar11));
      iVar40 = iVar40 + 1;
      uVar38 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar43 = puVar43 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  puVar42 = &DAT_0014b1ec;
  uVar48 = 0;
  iVar11 = 0;
  do {
    iVar9 = xmlMemBlocks();
    uVar49 = 0xffffffff;
    if (uVar48 < 3) {
      uVar49 = *puVar42;
    }
    htmlEntityValueLookup(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar10 - iVar9));
      iVar11 = iVar11 + 1;
      uVar38 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar42 = puVar42 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  puVar42 = &DAT_00157254;
  uVar48 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    uVar49 = 0xffffffff;
    if (uVar48 < 4) {
      uVar49 = *puVar42;
    }
    htmlHandleOmittedElem(uVar49);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar10 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar12 - iVar10));
      iVar9 = iVar9 + 1;
      uVar38 = (ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar42 = puVar42 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  htmlInitAutoClose();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar10 != iVar12) {
    iVar13 = xmlMemBlocks();
    uVar38 = (ulong)(uint)(iVar13 - iVar10);
    printf("Leak of %d blocks found in htmlInitAutoClose");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar46 = 0;
  iVar13 = 0;
  do {
    iVar15 = (int)uVar38;
    iVar14 = xmlMemBlocks();
    pxVar22 = gen_htmlDocPtr(iVar13,iVar15);
    uVar38 = 0;
    htmlIsAutoClosed(pxVar22);
    call_tests = call_tests + 1;
    if (((pxVar22 != (htmlDocPtr)0x0) && (api_doc != pxVar22)) && (pxVar22->doc != api_doc)) {
      xmlFreeDoc(pxVar22);
    }
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar15 - iVar14));
      iVar46 = iVar46 + 1;
      printf(" %d");
      uVar38 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar13 = iVar13 + 1;
  } while (iVar13 != 3);
  function_tests = function_tests + 1;
  puVar43 = &DAT_00159d60;
  uVar48 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    if (uVar48 < 4) {
      uVar41 = *puVar43;
    }
    else {
      uVar41 = 0;
    }
    htmlIsScriptAttribute(uVar41);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",(ulong)uVar48);
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar43 = puVar43 + 1;
  } while (uVar48 != 5);
  function_tests = function_tests + 1;
  iVar14 = xmlMemBlocks();
  lVar23 = htmlNewParserCtxt();
  if (lVar23 != 0) {
    htmlFreeParserCtxt(lVar23);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar15 = xmlMemBlocks();
  if (iVar14 != iVar15) {
    iVar16 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlNewParserCtxt",(ulong)(uint)(iVar16 - iVar14));
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    piVar47 = &call_tests;
    if (uVar48 != 0) {
      if (uVar48 == 1) {
        piVar47 = (int *)0xffffffffffffffff;
      }
      else {
        piVar47 = (int *)0x0;
      }
    }
    lVar23 = htmlNewSAXParserCtxt(0,piVar47);
    if (lVar23 != 0) {
      htmlFreeParserCtxt();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNewSAXParserCtxt",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar48);
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  puVar33 = &DAT_00157254;
  uVar48 = 0;
  local_74 = 0;
  do {
    iVar17 = xmlMemBlocks();
    pcVar44 = (char *)0xffffffff;
    if (uVar48 < 4) {
      pcVar44 = (char *)(ulong)*puVar33;
    }
    htmlNodeStatus(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar18 - iVar17));
      local_74 = local_74 + 1;
      printf(" %d",0);
      pcVar44 = (char *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
    puVar33 = puVar33 + 1;
  } while (uVar48 != 4);
  function_tests = function_tests + 1;
  uVar48 = 0;
  iVar17 = 0;
  do {
    iVar18 = xmlMemBlocks();
    pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)pcVar44);
    htmlParseCharRef(pxVar24);
    call_tests = call_tests + 1;
    if (pxVar24 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar24);
    }
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      pcVar44 = (char *)(ulong)uVar48;
      printf(" %d");
      putchar(10);
    }
    uVar48 = uVar48 + 1;
  } while (uVar48 != 3);
  function_tests = function_tests + 1;
  local_50 = 0;
  uVar48 = 0;
  do {
    iVar18 = 0;
    do {
      uVar35 = 0;
      do {
        puVar42 = &DAT_00157254;
        uVar31 = 0;
        do {
          iVar21 = (int)pcVar44;
          iVar19 = xmlMemBlocks();
          pxVar24 = gen_htmlParserCtxtPtr(uVar48,iVar21);
          if (iVar18 == 0) {
            pcVar44 = "foo";
LAB_00118f68:
            bVar51 = false;
          }
          else {
            if (iVar18 == 2) {
              pcVar44 = "test/ent2";
              goto LAB_00118f68;
            }
            if (iVar18 == 1) {
              bVar51 = false;
              pcVar44 = "<foo/>";
            }
            else {
              bVar51 = true;
              pcVar44 = (char *)0x0;
            }
          }
          uVar49 = 0xffffffff;
          iVar21 = -1;
          if (uVar35 < 4) {
            iVar21 = (&DAT_00157254)[uVar35];
          }
          if (uVar31 < 4) {
            uVar49 = *puVar42;
          }
          if ((!bVar51) && (iVar20 = xmlStrlen(pcVar44), iVar20 < iVar21)) {
            iVar21 = 0;
          }
          htmlParseChunk(pxVar24,pcVar44,iVar21,uVar49);
          if (pxVar24 == (htmlParserCtxtPtr)0x0) {
            call_tests = call_tests + 1;
          }
          else {
            xmlFreeDoc(pxVar24->myDoc);
            pxVar24->myDoc = (xmlDocPtr)0x0;
            call_tests = call_tests + 1;
            htmlFreeParserCtxt(pxVar24);
          }
          xmlResetLastError();
          iVar21 = xmlMemBlocks();
          if (iVar19 != iVar21) {
            iVar21 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar21 - iVar19));
            local_50 = local_50 + 1;
            printf(" %d",(ulong)uVar48);
            printf(" %d",iVar18);
            printf(" %d",(ulong)uVar35);
            pcVar44 = (char *)(ulong)uVar31;
            printf(" %d");
            putchar(10);
          }
          uVar31 = uVar31 + 1;
          puVar42 = puVar42 + 1;
        } while (uVar31 != 4);
        uVar35 = uVar35 + 1;
      } while (uVar35 != 4);
      iVar18 = iVar18 + 1;
    } while (iVar18 != 4);
    uVar48 = uVar48 + 1;
    if (uVar48 == 3) {
      iVar36 = iVar36 + iVar2 + local_3c + local_64 + iVar34 + iVar1 + iVar3 + iVar4 +
               (uint)(iVar6 != iVar5) + iVar8 + iVar40 + iVar11 + iVar9 + (uint)(iVar10 != iVar12) +
               iVar46 + iVar13 + (uint)(iVar14 != iVar15) + iVar16 + local_74;
      function_tests = function_tests + 1;
      iVar34 = 0;
      uVar48 = 0;
      do {
        puVar32 = &DAT_00159d48;
        uVar35 = 0;
        do {
          iVar1 = xmlMemBlocks();
          if (uVar48 < 4) {
            uVar41 = (&DAT_00159d60)[uVar48];
          }
          else {
            uVar41 = 0;
          }
          if (uVar35 < 3) {
            uVar27 = *puVar32;
          }
          else {
            uVar27 = 0;
          }
          pxVar25 = (xmlDocPtr)htmlParseDoc(uVar41);
          if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar2 - iVar1));
            iVar34 = iVar34 + 1;
            printf(" %d",(ulong)uVar48);
            uVar27 = (ulong)uVar35;
            printf(" %d");
            putchar(10);
          }
          uVar35 = uVar35 + 1;
          puVar32 = puVar32 + 1;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 5);
      function_tests = function_tests + 1;
      uVar48 = 0;
      iVar1 = 0;
      do {
        iVar2 = xmlMemBlocks();
        pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)uVar27);
        htmlParseDocument(pxVar24);
        if (pxVar24 == (htmlParserCtxtPtr)0x0) {
          call_tests = call_tests + 1;
        }
        else {
          xmlFreeDoc(pxVar24->myDoc);
          pxVar24->myDoc = (xmlDocPtr)0x0;
          call_tests = call_tests + 1;
          htmlFreeParserCtxt(pxVar24);
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar3 - iVar2));
          iVar1 = iVar1 + 1;
          uVar27 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != 3);
      function_tests = function_tests + 1;
      uVar48 = 0;
      iVar2 = 0;
      do {
        iVar3 = xmlMemBlocks();
        pxVar24 = gen_htmlParserCtxtPtr(uVar48,(int)uVar27);
        htmlParseElement(pxVar24);
        call_tests = call_tests + 1;
        if (pxVar24 != (htmlParserCtxtPtr)0x0) {
          htmlFreeParserCtxt(pxVar24);
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar4 - iVar3));
          iVar2 = iVar2 + 1;
          uVar27 = (ulong)uVar48;
          printf(" %d");
          putchar(10);
        }
        uVar48 = uVar48 + 1;
      } while (uVar48 != 3);
      function_tests = function_tests + 1;
      local_80 = 0;
      iVar3 = 0;
      do {
        iVar6 = (int)uVar27;
        iVar4 = xmlMemBlocks();
        pxVar24 = gen_htmlParserCtxtPtr(iVar3,iVar6);
        uVar27 = 0;
        htmlParseEntityRef(pxVar24);
        call_tests = call_tests + 1;
        if (pxVar24 != (htmlParserCtxtPtr)0x0) {
          htmlFreeParserCtxt(pxVar24);
        }
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar4 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar6 - iVar4));
          local_80 = local_80 + 1;
          printf(" %d");
          uVar27 = 0;
          printf(" %d");
          putchar(10);
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 != 3);
      function_tests = function_tests + 1;
      uVar48 = 0;
      do {
        puVar43 = &DAT_00159d48;
        uVar35 = 0;
        do {
          if (uVar48 < 7) {
            uVar41 = (&DAT_00159d80)[uVar48];
          }
          else {
            uVar41 = 0;
          }
          if (uVar35 < 3) {
            uVar28 = *puVar43;
          }
          else {
            uVar28 = 0;
          }
          pxVar25 = (xmlDocPtr)htmlParseFile(uVar41,uVar28);
          if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          uVar35 = uVar35 + 1;
          puVar43 = puVar43 + 1;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 8);
      function_tests = function_tests + 1;
      iVar3 = 0;
      uVar48 = 0;
      do {
        uVar27 = 0;
        do {
          uVar29 = 0;
          do {
            puVar42 = &DAT_00157254;
            uVar35 = 0;
            do {
              iVar4 = xmlMemBlocks();
              if (uVar48 < 4) {
                uVar41 = (&DAT_00159d60)[uVar48];
              }
              else {
                uVar41 = 0;
              }
              if ((uint)uVar27 < 3) {
                uVar28 = (&DAT_00159d48)[uVar27];
              }
              else {
                uVar28 = 0;
              }
              if ((uint)uVar29 < 3) {
                uVar30 = (&DAT_00159d48)[uVar29];
              }
              else {
                uVar30 = 0;
              }
              uVar49 = 0xffffffff;
              if (uVar35 < 4) {
                uVar49 = *puVar42;
              }
              pxVar25 = (xmlDocPtr)htmlReadDoc(uVar41,uVar28,uVar30,uVar49);
              if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc)
                 ) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar4 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar6 - iVar4));
                iVar3 = iVar3 + 1;
                printf(" %d",(ulong)uVar48);
                printf(" %d",uVar27);
                printf(" %d",uVar29);
                printf(" %d");
                putchar(10);
              }
              uVar35 = uVar35 + 1;
              puVar42 = puVar42 + 1;
            } while (uVar35 != 4);
            uVar35 = (uint)uVar29 + 1;
            uVar29 = (ulong)uVar35;
          } while (uVar35 != 4);
          uVar35 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar35;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 5);
      function_tests = function_tests + 1;
      local_64 = 0;
      uVar48 = 0;
      do {
        uVar27 = 0;
        do {
          uVar35 = 0;
          puVar42 = &DAT_00157254;
          do {
            iVar4 = xmlMemBlocks();
            if (uVar48 < 7) {
              uVar41 = (&DAT_00159d80)[uVar48];
            }
            else {
              uVar41 = 0;
            }
            if ((uint)uVar27 < 3) {
              uVar28 = (&DAT_00159d48)[uVar27];
            }
            else {
              uVar28 = 0;
            }
            uVar49 = 0xffffffff;
            if (uVar35 < 4) {
              uVar49 = *puVar42;
            }
            pxVar25 = (xmlDocPtr)htmlReadFile(uVar41,uVar28,uVar49);
            if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) && (pxVar25->doc != api_doc))
            {
              xmlFreeDoc();
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar6 = xmlMemBlocks();
            if (iVar4 != iVar6) {
              iVar6 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar6 - iVar4));
              local_64 = local_64 + 1;
              printf(" %d",(ulong)uVar48);
              printf(" %d",uVar27);
              printf(" %d");
              putchar(10);
            }
            uVar35 = uVar35 + 1;
            puVar42 = puVar42 + 1;
          } while (uVar35 != 4);
          uVar35 = (uint)uVar27 + 1;
          uVar27 = (ulong)uVar35;
        } while (uVar35 != 4);
        uVar48 = uVar48 + 1;
      } while (uVar48 != 8);
      function_tests = function_tests + 1;
      local_74 = 0;
      iVar4 = 0;
      do {
        uVar48 = 0;
        do {
          uVar35 = 0;
          do {
            uVar31 = 0;
            do {
              uVar27 = (ulong)uVar31;
              uVar29 = 0;
              puVar42 = &DAT_00157254;
              do {
                iVar6 = xmlMemBlocks();
                if (iVar4 == 0) {
                  pcVar44 = "foo";
LAB_001196e8:
                  bVar51 = false;
                }
                else {
                  if (iVar4 == 2) {
                    pcVar44 = "test/ent2";
                    goto LAB_001196e8;
                  }
                  if (iVar4 == 1) {
                    bVar51 = false;
                    pcVar44 = "<foo/>";
                  }
                  else {
                    bVar51 = true;
                    pcVar44 = (char *)0x0;
                  }
                }
                iVar5 = -1;
                if (uVar48 < 4) {
                  iVar5 = (&DAT_00157254)[uVar48];
                }
                if (uVar35 < 3) {
                  uVar41 = (&DAT_00159d48)[uVar35];
                }
                else {
                  uVar41 = 0;
                }
                if (uVar31 < 3) {
                  uVar28 = (&DAT_00159d48)[uVar27];
                }
                else {
                  uVar28 = 0;
                }
                uVar49 = 0xffffffff;
                if ((uint)uVar29 < 4) {
                  uVar49 = *puVar42;
                }
                if ((!bVar51) &&
                   (iVar8 = xmlStrlen(pcVar44,uVar27,extraout_RDX,uVar28), iVar8 < iVar5)) {
                  iVar5 = 0;
                }
                pxVar25 = (xmlDocPtr)htmlReadMemory(pcVar44,iVar5,uVar41,uVar28,uVar49);
                if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) &&
                   (pxVar25->doc != api_doc)) {
                  xmlFreeDoc();
                }
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar5 = xmlMemBlocks();
                if (iVar6 != iVar5) {
                  iVar5 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar5 - iVar6));
                  local_74 = local_74 + 1;
                  printf(" %d",iVar4);
                  printf(" %d",(ulong)uVar48);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",uVar27);
                  printf(" %d",uVar29);
                  putchar(10);
                }
                uVar7 = (uint)uVar29 + 1;
                uVar29 = (ulong)uVar7;
                puVar42 = puVar42 + 1;
              } while (uVar7 != 4);
              uVar31 = uVar31 + 1;
            } while (uVar31 != 4);
            uVar35 = uVar35 + 1;
          } while (uVar35 != 4);
          uVar48 = uVar48 + 1;
        } while (uVar48 != 4);
        iVar4 = iVar4 + 1;
        if (iVar4 == 4) {
          function_tests = function_tests + 1;
          iVar4 = 0;
          uVar48 = 0;
          do {
            uVar35 = 0;
            do {
              iVar6 = 0;
              do {
                iVar5 = xmlMemBlocks();
                if (uVar48 < 4) {
                  uVar41 = (&DAT_00159d60)[uVar48];
                }
                else {
                  uVar41 = 0;
                }
                if (uVar35 < 3) {
                  uVar28 = (&DAT_00159d48)[uVar35];
                }
                else {
                  uVar28 = 0;
                }
                piVar47 = &call_tests;
                if (iVar6 != 0) {
                  if (iVar6 == 1) {
                    piVar47 = (int *)0xffffffffffffffff;
                  }
                  else {
                    piVar47 = (int *)0x0;
                  }
                }
                pxVar25 = (xmlDocPtr)htmlSAXParseDoc(uVar41,uVar28,0,piVar47);
                if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) &&
                   (pxVar25->doc != api_doc)) {
                  xmlFreeDoc();
                }
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar8 = xmlMemBlocks();
                if (iVar5 != iVar8) {
                  iVar8 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar8 - iVar5));
                  iVar4 = iVar4 + 1;
                  printf(" %d",(ulong)uVar48);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",0);
                  printf(" %d");
                  putchar(10);
                }
                iVar6 = iVar6 + 1;
              } while (iVar6 != 3);
              uVar35 = uVar35 + 1;
            } while (uVar35 != 4);
            uVar48 = uVar48 + 1;
          } while (uVar48 != 5);
          function_tests = function_tests + 1;
          iVar6 = 0;
          uVar48 = 0;
          do {
            uVar35 = 0;
            do {
              iVar5 = 0;
              do {
                iVar8 = xmlMemBlocks();
                if (uVar48 < 7) {
                  uVar41 = (&DAT_00159d80)[uVar48];
                }
                else {
                  uVar41 = 0;
                }
                if (uVar35 < 3) {
                  uVar28 = (&DAT_00159d48)[uVar35];
                }
                else {
                  uVar28 = 0;
                }
                piVar47 = &call_tests;
                if (iVar5 != 0) {
                  if (iVar5 == 1) {
                    piVar47 = (int *)0xffffffffffffffff;
                  }
                  else {
                    piVar47 = (int *)0x0;
                  }
                }
                pxVar25 = (xmlDocPtr)htmlSAXParseFile(uVar41,uVar28,0,piVar47);
                if (((pxVar25 != (xmlDocPtr)0x0) && (api_doc != pxVar25)) &&
                   (pxVar25->doc != api_doc)) {
                  xmlFreeDoc();
                }
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar40 = xmlMemBlocks();
                if (iVar8 != iVar40) {
                  iVar40 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar40 - iVar8)
                        );
                  iVar6 = iVar6 + 1;
                  printf(" %d",(ulong)uVar48);
                  printf(" %d",(ulong)uVar35);
                  printf(" %d",0);
                  printf(" %d");
                  putchar(10);
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 != 3);
              uVar35 = uVar35 + 1;
            } while (uVar35 != 4);
            uVar48 = uVar48 + 1;
          } while (uVar48 != 8);
          function_tests = function_tests + 1;
          uVar48 = iVar36 + iVar17 + local_50 + iVar34 + iVar1 + iVar2 + local_80 + iVar3 + local_64
                   + local_74 + iVar4 + iVar6;
          if (uVar48 != 0) {
            printf("Module HTMLparser: %d errors\n",(ulong)uVar48);
          }
          return uVar48;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 37 of 43 functions ...\n");
    test_ret += test_UTF8ToHtml();
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateFileParserCtxt();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtParseDocument();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtSetOptions();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlInitAutoClose();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNewSAXParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}